

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidatorUtils.hpp
# Opt level: O0

Result * CoreML::validateInputCount
                   (Result *__return_storage_ptr__,NeuralNetworkLayer *layer,int min,int max)

{
  int iVar1;
  LayerCase LVar2;
  string *psVar3;
  string local_4d8;
  string local_4b8;
  string local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  string local_358;
  string local_338;
  string local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  undefined4 local_1d4;
  string local_1d0;
  string local_1b0;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_40 [8];
  string err;
  int max_local;
  int min_local;
  NeuralNetworkLayer *layer_local;
  
  err.field_2._8_4_ = max;
  err.field_2._12_4_ = min;
  if (max < min && -1 < max) {
    __assert_fail("min <= max || max < 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/src/Validation/NeuralNetwork/NeuralNetworkValidatorUtils.hpp"
                  ,0x62,
                  "Result CoreML::validateInputCount(const Specification::NeuralNetworkLayer &, int, int)"
                 );
  }
  std::__cxx11::string::string((string *)local_40);
  if ((((int)err.field_2._8_4_ < 1) || (err.field_2._8_4_ != err.field_2._12_4_)) ||
     (iVar1 = Specification::NeuralNetworkLayer::input_size(layer), iVar1 == err.field_2._8_4_)) {
    if (((int)err.field_2._12_4_ < 1) ||
       (iVar1 = Specification::NeuralNetworkLayer::input_size(layer),
       (int)err.field_2._12_4_ <= iVar1)) {
      if (((int)err.field_2._8_4_ < 1) ||
         (iVar1 = Specification::NeuralNetworkLayer::input_size(layer),
         iVar1 <= (int)err.field_2._8_4_)) {
        Result::Result(__return_storage_ptr__);
      }
      else {
        psVar3 = Specification::NeuralNetworkLayer::name_abi_cxx11_(layer);
        std::__cxx11::string::string((string *)&local_478,(string *)psVar3);
        std::operator+(&local_458,"Layer \'",&local_478);
        std::operator+(&local_438,&local_458,"\' of type ");
        LVar2 = Specification::NeuralNetworkLayer::layer_case(layer);
        std::__cxx11::to_string(&local_498,LVar2);
        std::operator+(&local_418,&local_438,&local_498);
        std::operator+(&local_3f8,&local_418," has ");
        iVar1 = Specification::NeuralNetworkLayer::input_size(layer);
        std::__cxx11::to_string(&local_4b8,iVar1);
        std::operator+(&local_3d8,&local_3f8,&local_4b8);
        std::operator+(&local_3b8,&local_3d8," inputs but expects at most ");
        std::__cxx11::to_string(&local_4d8,err.field_2._8_4_);
        std::operator+(&local_398,&local_3b8,&local_4d8);
        std::operator+(&local_378,&local_398,".");
        std::__cxx11::string::operator=((string *)local_40,(string *)&local_378);
        std::__cxx11::string::~string((string *)&local_378);
        std::__cxx11::string::~string((string *)&local_398);
        std::__cxx11::string::~string((string *)&local_4d8);
        std::__cxx11::string::~string((string *)&local_3b8);
        std::__cxx11::string::~string((string *)&local_3d8);
        std::__cxx11::string::~string((string *)&local_4b8);
        std::__cxx11::string::~string((string *)&local_3f8);
        std::__cxx11::string::~string((string *)&local_418);
        std::__cxx11::string::~string((string *)&local_498);
        std::__cxx11::string::~string((string *)&local_438);
        std::__cxx11::string::~string((string *)&local_458);
        std::__cxx11::string::~string((string *)&local_478);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_40);
      }
    }
    else {
      psVar3 = Specification::NeuralNetworkLayer::name_abi_cxx11_(layer);
      std::__cxx11::string::string((string *)&local_2f8,(string *)psVar3);
      std::operator+(&local_2d8,"Layer \'",&local_2f8);
      std::operator+(&local_2b8,&local_2d8,"\' of type ");
      LVar2 = Specification::NeuralNetworkLayer::layer_case(layer);
      std::__cxx11::to_string(&local_318,LVar2);
      std::operator+(&local_298,&local_2b8,&local_318);
      std::operator+(&local_278,&local_298," has ");
      iVar1 = Specification::NeuralNetworkLayer::input_size(layer);
      std::__cxx11::to_string(&local_338,iVar1);
      std::operator+(&local_258,&local_278,&local_338);
      std::operator+(&local_238,&local_258," inputs but expects at least ");
      std::__cxx11::to_string(&local_358,err.field_2._12_4_);
      std::operator+(&local_218,&local_238,&local_358);
      std::operator+(&local_1f8,&local_218,".");
      std::__cxx11::string::operator=((string *)local_40,(string *)&local_1f8);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::string::~string((string *)&local_218);
      std::__cxx11::string::~string((string *)&local_358);
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::string::~string((string *)&local_258);
      std::__cxx11::string::~string((string *)&local_338);
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::string::~string((string *)&local_298);
      std::__cxx11::string::~string((string *)&local_318);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::__cxx11::string::~string((string *)&local_2f8);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_40);
    }
  }
  else {
    psVar3 = Specification::NeuralNetworkLayer::name_abi_cxx11_(layer);
    std::__cxx11::string::string((string *)&local_170,(string *)psVar3);
    std::operator+(&local_150,"Layer \'",&local_170);
    std::operator+(&local_130,&local_150,"\' of type ");
    LVar2 = Specification::NeuralNetworkLayer::layer_case(layer);
    std::__cxx11::to_string(&local_190,LVar2);
    std::operator+(&local_110,&local_130,&local_190);
    std::operator+(&local_f0,&local_110," has ");
    iVar1 = Specification::NeuralNetworkLayer::input_size(layer);
    std::__cxx11::to_string(&local_1b0,iVar1);
    std::operator+(&local_d0,&local_f0,&local_1b0);
    std::operator+(&local_b0,&local_d0," inputs but expects exactly ");
    std::__cxx11::to_string(&local_1d0,err.field_2._12_4_);
    std::operator+(&local_90,&local_b0,&local_1d0);
    std::operator+(&local_70,&local_90,".");
    std::__cxx11::string::operator=((string *)local_40,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_40);
  }
  local_1d4 = 1;
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

inline Result validateInputCount(const Specification::NeuralNetworkLayer& layer, int min, int max) {

    assert( min <= max || max < 0 );
    std::string err;

    if (max > 0 && max == min && layer.input_size() != max) {
        err = "Layer '" + std::string(layer.name()) + "' of type " + std::to_string(layer.layer_case()) + " has " + std::to_string(layer.input_size()) + " inputs but expects exactly " + std::to_string(min) + ".";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    else if (min > 0 && layer.input_size() < min) {
        err = "Layer '" + std::string(layer.name()) + "' of type " + std::to_string(layer.layer_case()) + + " has " + std::to_string(layer.input_size()) + " inputs but expects at least " + std::to_string(min) + ".";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    else if (max > 0 && layer.input_size() > max) {
        err = "Layer '" + std::string(layer.name()) + "' of type " + std::to_string(layer.layer_case()) + + " has " + std::to_string(layer.input_size()) + " inputs but expects at most " + std::to_string(max) + ".";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    else {
        return Result();
    }
}